

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VtoVCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  int iVar8;
  Fts5Tokenizer *p;
  long in_FS_OFFSET;
  int rc;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rc = 0;
  p = (Fts5Tokenizer *)sqlite3Fts5MallocZero(&rc,0x48);
  iVar8 = rc;
  if (rc == 0) {
    *(undefined8 *)(p + 0x18) = *(undefined8 *)((long)pCtx + 0x28);
    uVar7 = *(undefined8 *)((long)pCtx + 0x20);
    *(undefined8 *)(p + 8) = *(undefined8 *)((long)pCtx + 0x18);
    *(undefined8 *)(p + 0x10) = uVar7;
    iVar8 = *(int *)((long)pCtx + 0x34);
    iVar1 = *(int *)((long)pCtx + 0x38);
    iVar2 = *(int *)((long)pCtx + 0x3c);
    iVar3 = *(int *)((long)pCtx + 0x40);
    iVar4 = *(int *)((long)pCtx + 0x44);
    iVar5 = *(int *)((long)pCtx + 0x48);
    iVar6 = *(int *)((long)pCtx + 0x4c);
    *(int *)(p + 0x20) = *(int *)((long)pCtx + 0x30);
    *(int *)(p + 0x24) = iVar8;
    *(int *)(p + 0x28) = iVar1;
    *(int *)(p + 0x2c) = iVar2;
    *(int *)(p + 0x30) = iVar3;
    *(int *)(p + 0x34) = iVar4;
    *(int *)(p + 0x38) = iVar5;
    *(int *)(p + 0x3c) = iVar6;
    iVar8 = *(int *)((long)pCtx + 0x10);
    *(int *)p = iVar8;
    iVar8 = (**(code **)((long)pCtx + (ulong)(iVar8 != 0) * 0x20 + 0x18))
                      (*(undefined8 *)((long)pCtx + 8),azArg,nArg,p + 0x40);
    if (iVar8 == 0) {
      iVar8 = 0;
    }
    else {
      sqlite3_free(p);
      p = (Fts5Tokenizer *)0x0;
    }
  }
  *ppOut = p;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VtoVCreate(
  void *pCtx,
  const char **azArg,
  int nArg,
  Fts5Tokenizer **ppOut
){
  Fts5TokenizerModule *pMod = (Fts5TokenizerModule*)pCtx;
  Fts5VtoVTokenizer *pNew = 0;
  int rc = SQLITE_OK;

  pNew = (Fts5VtoVTokenizer*)sqlite3Fts5MallocZero(&rc, sizeof(*pNew));
  if( rc==SQLITE_OK ){
    pNew->x1 = pMod->x1;
    pNew->x2 = pMod->x2;
    pNew->bV2Native = pMod->bV2Native;
    if( pMod->bV2Native ){
      rc = pMod->x2.xCreate(pMod->pUserData, azArg, nArg, &pNew->pReal);
    }else{
      rc = pMod->x1.xCreate(pMod->pUserData, azArg, nArg, &pNew->pReal);
    }
    if( rc!=SQLITE_OK ){
      sqlite3_free(pNew);
      pNew = 0;
    }
  }

  *ppOut = (Fts5Tokenizer*)pNew;
  return rc;
}